

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall
Assembler::processLdStrAbsolute(Assembler *this,string *instruction,int reg,string *operand)

{
  bool bVar1;
  int iVar2;
  Assembler *this_00;
  string *instrDescr;
  string local_b0;
  undefined1 local_90 [64];
  string local_50;
  
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (operand,&symbolReg_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::string::string((string *)(local_90 + 0x40),(string *)operand);
    iVar2 = processAbsoluteAddressingSymbol(this,(string *)(local_90 + 0x40));
    std::__cxx11::string::~string((string *)(local_90 + 0x40));
    instrDescr = (string *)(local_90 + 0x20);
    std::__cxx11::string::string((string *)instrDescr,(string *)instruction);
    instr5Bytes(this,instrDescr,reg + 0xf,0,iVar2);
  }
  else {
    this_00 = (Assembler *)local_90;
    std::__cxx11::string::string((string *)local_90,(string *)operand);
    iVar2 = literalToDecimal(this_00,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    instrDescr = &local_b0;
    std::__cxx11::string::string((string *)instrDescr,(string *)instruction);
    instr5Bytes(this,instrDescr,reg + 0xf,0,iVar2);
  }
  std::__cxx11::string::~string((string *)instrDescr);
  return;
}

Assistant:

void Assembler::processLdStrAbsolute(string instruction, int reg, string operand) {
    int regs = reg + 0xF;
    int adr = 0;
    int value;
    if (regex_match(operand, symbolReg)) {
        value = processAbsoluteAddressingSymbol(operand);
        instr5Bytes(instruction, regs, adr, value);
    } else {
        value = literalToDecimal(operand);
        instr5Bytes(instruction, regs, adr, value);
    }
    return;
}